

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O3

void __thiscall nuraft::raft_server::set_user_ctx(raft_server *this,string *ctx)

{
  undefined8 uVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  ptr<cluster_config> cloned_config;
  ptr<log_entry> entry;
  ptr<buffer> new_conf_buf;
  ptr<buffer> enc_conf;
  ptr<cluster_config> c_conf;
  log_val_type local_7a;
  undefined1 local_79;
  undefined1 local_78 [16];
  ptr<log_entry> local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  unsigned_long local_20;
  
  get_config((raft_server *)(local_48 + 0x10));
  cluster_config::serialize((cluster_config *)local_48);
  cluster_config::deserialize((cluster_config *)local_78,(buffer *)local_48._0_8_);
  uVar1 = local_78._0_8_;
  iVar2 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_log_store[2])();
  *(undefined8 *)(uVar1 + 8) = *(undefined8 *)uVar1;
  *(ulong *)uVar1 = CONCAT44(extraout_var,iVar2);
  std::__cxx11::string::_M_assign((string *)(local_78._0_8_ + 0x18));
  cluster_config::serialize((cluster_config *)local_58);
  local_20 = (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->term_).super___atomic_base<unsigned_long>._M_i;
  local_7a = conf;
  lVar3 = std::chrono::_V2::system_clock::now();
  local_30._8_8_ = lVar3 / 1000;
  local_68.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nuraft::log_entry,std::allocator<nuraft::log_entry>,unsigned_long,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type,unsigned_long>
            (&local_68.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(log_entry **)&local_68,(allocator<nuraft::log_entry> *)&local_79,&local_20,
             (shared_ptr<nuraft::buffer> *)local_58,&local_7a,
             (unsigned_long *)(local_30._M_local_buf + 8));
  store_log_entry(this,&local_68,0);
  request_append_entries(this);
  if (local_68.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._M_allocated_capacity !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._M_allocated_capacity);
  }
  return;
}

Assistant:

void raft_server::set_user_ctx(const std::string& ctx) {
    // Clone current cluster config.
    ptr<cluster_config> c_conf = get_config();
    ptr<buffer> enc_conf = c_conf->serialize();
    ptr<cluster_config> cloned_config = cluster_config::deserialize(*enc_conf);

    // Create a log for new configuration, it should be replicated.
    cloned_config->set_log_idx(log_store_->next_slot());
    cloned_config->set_user_ctx(ctx);

    ptr<buffer> new_conf_buf = cloned_config->serialize();
    ptr<log_entry> entry = cs_new<log_entry>
                           ( state_->get_term(),
                             new_conf_buf,
                             log_val_type::conf,
                             timer_helper::get_timeofday_us() );
    store_log_entry(entry);
    request_append_entries();
}